

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogSerializer::WriteAheadLogSerializer
          (WriteAheadLogSerializer *this,WriteAheadLog *wal,WALType wal_type)

{
  BinarySerializer *this_00;
  WALType wal_type_local;
  undefined1 local_50 [56];
  
  wal_type_local = wal_type;
  ChecksumWriter::ChecksumWriter(&this->checksum_writer,wal);
  SerializationOptions::SerializationOptions(&this->options);
  SerializationOptions::SerializationOptions((SerializationOptions *)local_50,wal->database);
  this_00 = &this->serializer;
  BinarySerializer::BinarySerializer(this_00,(WriteStream *)this,(SerializationOptions *)local_50);
  ::std::__cxx11::string::~string((string *)(local_50 + 8));
  if ((wal->init_state)._M_i != INITIALIZED) {
    WriteAheadLog::Initialize(wal);
  }
  WriteAheadLog::WriteVersion(wal);
  BinarySerializer::OnObjectBegin(this_00);
  Serializer::WriteProperty<duckdb::WALType>
            (&this_00->super_Serializer,100,"wal_type",&wal_type_local);
  return;
}

Assistant:

WriteAheadLogSerializer(WriteAheadLog &wal, WALType wal_type)
	    : checksum_writer(wal), serializer(checksum_writer, SerializationOptions(wal.GetDatabase())) {
		if (!wal.Initialized()) {
			wal.Initialize();
		}
		// write a version marker if none has been written yet
		wal.WriteVersion();
		serializer.Begin();
		serializer.WriteProperty(100, "wal_type", wal_type);
	}